

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

bool __thiscall toml::internal::Parser::parseKeyValue(Parser *this,Value *current)

{
  bool bVar1;
  undefined1 uVar2;
  Value *in_RDI;
  Value v;
  string key;
  Parser *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  Parser *in_stack_ffffffffffffff08;
  allocator *paVar3;
  string local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  anon_union_8_8_51f126cb_for_Value_2 in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  Value *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [8];
  Value *in_stack_ffffffffffffffa0;
  Parser *in_stack_ffffffffffffffa8;
  string local_38 [55];
  byte local_1;
  
  std::__cxx11::string::string(local_38);
  bVar1 = parseKey(in_stack_ffffffffffffff08,
                   (string *)
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,
                                     CONCAT15(in_stack_ffffffffffffff05,
                                              CONCAT14(in_stack_ffffffffffffff04,
                                                       in_stack_ffffffffffffff00)))));
  if (bVar1) {
    bVar1 = consumeForValue(in_stack_ffffffffffffff08,
                            CONCAT13(in_stack_ffffffffffffff07,
                                     CONCAT12(in_stack_ffffffffffffff06,
                                              CONCAT11(in_stack_ffffffffffffff05,
                                                       in_stack_ffffffffffffff04))));
    if (bVar1) {
      Value::Value((Value *)&stack0xffffffffffffff58);
      uVar2 = parseValue(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if ((bool)uVar2) {
        bVar1 = consumeEOLorEOFForKey(in_stack_fffffffffffffef8);
        if (bVar1) {
          bVar1 = Value::has((Value *)CONCAT17(uVar2,CONCAT16(bVar1,CONCAT15(
                                                  in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           in_stack_ffffffffffffff00)))),
                             (string *)in_stack_fffffffffffffef8);
          if (bVar1) {
            std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
            addError((Parser *)key.field_2._M_allocated_capacity,(string *)key._M_string_length);
            std::__cxx11::string::~string(local_c8);
            local_1 = 0;
          }
          else {
            Value::setChild(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                            (Value *)in_stack_ffffffffffffff60.string_);
            local_1 = 1;
          }
        }
        else {
          local_1 = 0;
        }
      }
      else {
        local_1 = 0;
      }
      Value::~Value(in_RDI);
    }
    else {
      paVar3 = (allocator *)&stack0xffffffffffffff6f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff70,"no equal?",paVar3);
      addError((Parser *)key.field_2._M_allocated_capacity,(string *)key._M_string_length);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
      local_1 = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"parse key failed",&local_69);
    addError((Parser *)key.field_2._M_allocated_capacity,(string *)key._M_string_length);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_1 = 0;
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool Parser::parseKeyValue(Value* current)
{
    std::string key;
    if (!parseKey(&key)) {
        addError("parse key failed");
        return false;
    }
    if (!consumeForValue(TokenType::EQUAL)) {
        addError("no equal?");
        return false;
    }

    Value v;
    if (!parseValue(&v))
        return false;
    if (!consumeEOLorEOFForKey())
        return false;

    if (current->has(key)) {
        addError("Multiple same key: " + key);
        return false;
    }

    current->setChild(key, std::move(v));
    return true;
}